

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetBXMarkerInfo(ndicapi *pol,int portHandle,int marker,char *outMarkerInfo)

{
  int byteIndex;
  int n;
  int i;
  char *outMarkerInfo_local;
  int marker_local;
  int portHandle_local;
  ndicapi *pol_local;
  
  if (marker < 0x14) {
    byteIndex = 0;
    while ((byteIndex < (int)(uint)pol->BxHandleCount && (pol->BxHandles[byteIndex] != portHandle)))
    {
      byteIndex = byteIndex + 1;
    }
    if (byteIndex == (uint)pol->BxHandleCount) {
      pol_local._4_4_ = 1;
    }
    else {
      if (marker % 2 == 0) {
        *outMarkerInfo = pol->BxToolMarkerInformation[byteIndex][0xb - marker / 2];
      }
      else {
        *outMarkerInfo = pol->BxToolMarkerInformation[byteIndex][0xb - marker / 2] & 0xf0;
      }
      pol_local._4_4_ = 0;
    }
  }
  else {
    pol_local._4_4_ = 0;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetBXMarkerInfo(ndicapi* pol, int portHandle, int marker, char& outMarkerInfo)
{
  int i, n;

  if (marker >= 20)
  {
    return false;
  }

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  int byteIndex = marker / 2;
  if (marker % 2 == 0)
  {
    // low 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0x00FF;
  }
  else
  {
    // high 4 bits, little endian format, so index backwards from the rear
    outMarkerInfo = pol->BxToolMarkerInformation[i][1 + (10 - byteIndex)] & 0xFF00 >> 4;
  }
  return NDI_OKAY;
}